

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
         *this,Entry *row)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 row_00;
  uint skip;
  size_t pos;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  Entry *pEVar2;
  Maybe<unsigned_long> local_38;
  undefined1 local_28 [8];
  NullableValue<unsigned_long> existing;
  Entry *row_local;
  Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
  *this_local;
  
  existing.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)row;
  pos = Vector<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::size(&this->rows);
  row_00 = existing.field_1;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  Impl<0UL,_false>::insert((Impl<0UL,_false> *)&local_38,this,pos,(Entry *)row_00,skip);
  other = kj::_::readMaybe<unsigned_long>(&local_38);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_28,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_38);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_28);
  if (puVar1 != (unsigned_long *)0x0) {
    kj::_::throwDuplicateTableRow();
  }
  pEVar2 = mv<kj::HashMap<kj::StringPtr,unsigned_short>::Entry>((Entry *)existing.field_1);
  pEVar2 = Vector<kj::HashMap<kj::StringPtr,unsigned_short>::Entry>::
           add<kj::HashMap<kj::StringPtr,unsigned_short>::Entry>
                     ((Vector<kj::HashMap<kj::StringPtr,unsigned_short>::Entry> *)this,pEVar2);
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_28);
  return pEVar2;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }